

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall
ON_TextureMapping::EvaluateCylinderMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  uint uVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  ON_3dPoint local_c8;
  double t0;
  double local_a0;
  undefined4 local_94;
  double t1;
  ON_3dVector n;
  ON_3dPoint local_70;
  ON_3dVector *local_58;
  undefined8 uStack_50;
  ON_3dVector local_48;
  
  ON_Xform::operator*(&local_c8,&this->m_Pxyz,P);
  local_a0 = ON_2dVector::Length((ON_2dVector *)&local_c8);
  uVar4 = 0;
  if (this->m_projection == ray_projection) {
    ON_Xform::operator*(&n,&this->m_Nxyz,N);
    uVar4 = 0;
    dVar6 = 0.0;
    if (((this->m_bCapped == true) && (dVar6 = ABS(n.z) * 1e+100, ABS(local_c8.z + 1.0) < dVar6)) &&
       (ABS(1.0 - local_c8.z) < dVar6)) {
      t0 = (-1.0 - local_c8.z) / n.z;
      local_58 = N;
      ::operator*(&local_48,t0,&n);
      pOVar3 = ON_3dPoint::operator+(&local_70,&local_c8,&local_48);
      if ((1.490116119385e-08 < ABS(local_70.z + 1.0)) ||
         (1.0000000298023226 < local_70.x * local_70.x + local_70.y * local_70.y)) {
        uVar4 = 0;
        local_94 = (undefined4)CONCAT71((int7)((ulong)pOVar3 >> 8),1);
      }
      else {
        uVar4 = 2;
        local_94 = 0;
      }
      t1 = (1.0 - local_c8.z) / n.z;
      ::operator*(&local_48,t1,&n);
      ON_3dPoint::operator+(&local_70,&local_c8,&local_48);
      if ((1.490116119385e-08 < ABS(1.0 - local_70.z)) ||
         (1.0000000298023226 < local_70.x * local_70.x + local_70.y * local_70.y)) {
        uVar1 = 0;
      }
      else {
        uVar1 = 3;
      }
      N = local_58;
      if ((((char)local_94 != '\0') || (t0 < 0.0 && t0 < t1)) || (dVar6 = t0, 0.0 <= t1 && t1 < t0))
      {
        dVar6 = t1;
        uVar4 = uVar1;
      }
    }
    uStack_50 = 0;
    dVar5 = n.x * local_c8.x + n.y * local_c8.y;
    local_58 = (ON_3dVector *)dVar6;
    iVar2 = ON_SolveQuadraticEquation
                      (n.x * n.x + n.y * n.y,dVar5 + dVar5,
                       local_c8.x * local_c8.x + local_c8.y * local_c8.y + -1.0,&t0,&t1);
    if (iVar2 < 0) {
LAB_004f252e:
      if (1 < uVar4) {
        ::operator*(&local_48,(double)local_58,&n);
        ON_3dPoint::operator+(&local_70,&local_c8,&local_48);
        local_c8.z = local_70.z;
        local_c8.x = local_70.x;
        local_c8.y = local_70.y;
      }
    }
    else {
      if ((iVar2 != 2) && ((t0 < 0.0 && t0 < t1 || (0.0 <= t1 && t1 < t0)))) {
        t0 = t1;
      }
      if (uVar4 == 0) {
        ::operator*(&local_48,t0,&n);
        ON_3dPoint::operator+(&local_70,&local_c8,&local_48);
        local_c8.z = local_70.z;
        local_c8.x = local_70.x;
        local_c8.y = local_70.y;
      }
      else {
        if (((t0 < 0.0 && t0 < (double)local_58) ||
            (0.0 <= (double)local_58 && (double)local_58 < t0)) ||
           (t1 = n.z * t0 + local_c8.z, 1.0000000149011612 < ABS(t1))) goto LAB_004f252e;
        local_c8.y = t0 * n.y + local_c8.y;
        local_c8.x = t1;
      }
      uVar4 = 1;
    }
  }
  if ((uVar4 == 0) && (this->m_bCapped != false)) {
    if (ABS(local_c8.z) <= 1.0000000149011612) {
      if (local_a0 <= 1.001) {
        ON_Xform::operator*(&n,&this->m_Nxyz,N);
        uVar4 = 0;
        if ((ABS(n.x) < ABS(n.z)) && (ABS(n.y) < ABS(n.z))) {
          uVar4 = n.z < 0.0 ^ 3;
        }
        goto LAB_004f26c4;
      }
    }
    else if (local_a0 < ABS(local_c8.z)) {
      uVar4 = local_c8.z < 0.0 ^ 3;
      goto LAB_004f26c4;
    }
  }
  else {
LAB_004f26c4:
    if ((uVar4 & 2) != 0) {
      if (uVar4 == 2) {
        local_c8.x = -local_c8.x;
      }
      if (this->m_texture_space == divided) {
        if (0.9999999850988388 <= local_a0) {
          dVar6 = local_a0 + 1.490116119385e-08;
LAB_004f27b1:
          local_c8.x = local_c8.x / dVar6;
          local_c8.y = local_c8.y / dVar6;
        }
      }
      else {
        dVar6 = local_a0;
        if (1.0 < local_a0) goto LAB_004f27b1;
      }
      local_c8.x = local_c8.x * 0.5 + 0.5;
      if (0.0 <= local_c8.x) {
        if (1.0 < local_c8.x) {
          local_c8.x = 1.0;
        }
      }
      else {
        local_c8.x = 0.0;
      }
      local_c8.y = local_c8.y * 0.5 + 0.5;
      dVar6 = 0.0;
      if ((local_c8.y < 0.0) || (dVar6 = 1.0, 1.0 < local_c8.y)) {
        local_c8.y = dVar6;
      }
      if (this->m_texture_space == divided) {
        local_c8.x = (local_c8.x + (double)(uVar4 + 2)) / 6.0;
      }
      goto LAB_004f28e1;
    }
  }
  dVar6 = 0.0;
  if ((((local_c8.y != 0.0) || (NAN(local_c8.y))) || (local_c8.x != 0.0)) || (NAN(local_c8.x))) {
    dVar6 = atan2(local_c8.y,local_c8.x);
    dVar6 = dVar6 * 0.5;
  }
  local_c8.x = dVar6 / 3.141592653589793;
  if (-2.220446049250313e-16 <= local_c8.x) {
    if (0.0 <= local_c8.x) {
      if (1.0 < local_c8.x) {
        local_c8.x = 1.0;
      }
    }
    else {
      local_c8.x = 0.0;
    }
  }
  else {
    local_c8.x = local_c8.x + 1.0;
  }
  if (this->m_texture_space == divided) {
    local_c8.x = (local_c8.x + local_c8.x) / 3.0;
  }
  uVar4 = 1;
  local_c8.y = local_c8.z * 0.5 + 0.5;
  if (this->m_bCapped == true) {
    if (0.0 <= local_c8.y) {
      if (1.0 < local_c8.y) {
        local_c8.y = 1.0;
      }
    }
    else {
      local_c8.y = 0.0;
    }
  }
LAB_004f28e1:
  local_c8.z = local_a0;
  ON_Xform::operator*((ON_3dPoint *)&n,&this->m_uvw,&local_c8);
  T->z = n.z;
  T->x = n.x;
  T->y = n.y;
  return uVar4;
}

Assistant:

int ON_TextureMapping::EvaluateCylinderMapping(
												const ON_3dPoint& P,
												const ON_3dVector& N,
												ON_3dPoint* T
												) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping cylinder" into the cylinder centered at
  // rst = (0,0,0) with radius 1.0.  The axis runs
  // from rst = (0,0,-1) to rst = (0,0,+1).

	ON_3dPoint rst(m_Pxyz*P);

	ON_3dPoint Q;
	const double r = ((const ON_2dVector*)(&rst.x))->Length();
	double t, t0, t1;
	int side0, side1;
	PROJECTION mapping_proj = m_projection;

	side0 = 0;
	if ( ON_TextureMapping::PROJECTION::ray_projection == mapping_proj )
	{
		ON_3dVector n(m_Nxyz*N);
		t = 0.0;

		if ( m_bCapped )
		{
			// shoot at caps
			//  The < t check prevents overflow when the
			//  ray is nearly parallel to the cap.
			t = fabs(n.z)*on__overflow_tol;
			if ( fabs(1.0+rst.z) < t && fabs(1.0-rst.z) < t )
			{
				side0 = 2;
				side1 = 3;

				t0 = (-1.0 - rst.z)/n.z;
				Q = rst + t0*n;
				if ( fabs(1.0+Q.z) > ON_SQRT_EPSILON
					|| (Q.x*Q.x + Q.y*Q.y) > 1.0 + 2.0*ON_SQRT_EPSILON + ON_EPSILON )
				{
          // The ray's intersection with the bottom plane missed the
          // radius 1 disk that is the bottom of the cylinder.
					side0 = 0;
				}

				t1 = ( 1.0 - rst.z)/n.z;
				Q = rst + t1*n;
				if ( fabs(1.0-Q.z) > ON_SQRT_EPSILON
					|| (Q.x*Q.x + Q.y*Q.y) > 1.0 + 2.0*ON_SQRT_EPSILON + ON_EPSILON )
				{
          // The ray's intersection with the top plane missed the
          // radius 1 disk that is the top of the cylinder.
					side1 = 0;
				}
				if ( 0 == side0 || 1 == BestHitHelper(t0,t1) )
				{
					side0 = side1;
					t = t1;
				}
				else
				{
					t = t0;
				}
			}
		}

		// shoot ray at the cylinder wall
		int rc = ON_SolveQuadraticEquation( (n.x*n.x+n.y*n.y),
			2.0*(rst.x*n.x+rst.y*n.y),
			(rst.x*rst.x+rst.y*rst.y) - 1.0,
			&t0, &t1 );
		if (rc >= 0 )
		{
			if ( 2 != rc  && 1 == BestHitHelper(t0,t1) )
			{
				t0 = t1;
			}
			if ( 0 == side0 )
			{
				// Either the caps are missing or the ray missed the caps.
        // The best hit is the cylinder wall.
				side0 = 1;
				rst = rst + t0*n;
			}
			else if ( 1 != BestHitHelper(t0,t) )
			{
				// The cylinder is capped and the ray hit the cap,
        // hit the infinite cylinder wall, and the wall
        // hit is "first".  If the ray hits the finite
        // cylinder wall, the I will use the wall hit.
				t1 = rst.z + t0*n.z;
				if ( t1 >= -(1.0+ON_SQRT_EPSILON) && t1 <= 1.0+ON_SQRT_EPSILON )
				{
					// use the hit on the cylinder wall
					side0 = 1;
					rst.x = rst.x + t0*n.x;
					rst.y = rst.y + t0*n.y;
          rst.x = t1;
				}
			}
		}

		if ( side0 > 1 )
		{
			// best hit is on a cap
			rst = rst + t*n;
		}
	}

	if ( m_bCapped && 0 == side0 )
	{
    if ( fabs(rst.z) > 1.0+ON_SQRT_EPSILON )
    {
      if ( fabs(rst.z) > r )
      {
        side0 = (rst.z < 0.0) ? 2 : 3;
      }
    }
    else if ( r <= 1.001 )
    {
      // The point is inside the capped cylinder.
      // Use normal to determine which surface to use
      // for closest point test.
		  ON_3dVector n(m_Nxyz*N);
      if (  ( fabs(n.z) > fabs(n.x) && fabs(n.z) > fabs(n.y) ) )
      {
        side0 = (n.z < 0.0) ? 2 : 3;
      }
    }
	}

	if ( 2 == side0 || 3 == side0 )
	{
    // The cylinder is capped and P maps to
    // the top (1 == side0) or bottom (2 == side0)

    if ( 2 == side0 )
    {
      // This is the same convention as box mapping.
      // Put another way, if you change the mapping
      // between box and cylinder, you get the same
      // picture on the top and bottom.
      rst.x = -rst.x;
    }

		if ( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space )
		{
		  if ( r >= 1.0-ON_SQRT_EPSILON )
		  {
			  rst.x /= (r+ON_SQRT_EPSILON);
			  rst.y /= (r+ON_SQRT_EPSILON);
		  }
    }
    else if ( r > 1.0 )
	  {
		  rst.x /= r;
		  rst.y /= r;
	  }


    // convert to normalized texture coordinates
		rst.x = 0.5*rst.x + 0.5;
    if ( rst.x < 0.0) rst.x = 0.0; else if (rst.x > 1.0) rst.x = 1.0;
		rst.y = 0.5*rst.y + 0.5;
    if ( rst.y < 0.0) rst.y = 0.0; else if (rst.y > 1.0) rst.y = 1.0;

		if ( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space )
		{
      // bottom uses 4/6 <= x <= 5/6 region of the texture map.
      // top uses 5/6 <= x <= 1 region of the texture map.
			rst.x = (2.0 + side0 + rst.x)/6.0;
		}
	}
	else
	{
    // P maps to side of the cylinder.
    //
    // convert longitude to normalized texture coordinate
		t = (0.0 != rst.y || 0.0 != rst.x) ? atan2(rst.y,rst.x) : 0.0;
		rst.x = 0.5*t/ON_PI;
		if ( rst.x < -ON_EPSILON )
			rst.x += 1.0;
		else if (rst.x < 0.0 )
			rst.x = 0.0;
		else if (rst.x > 1.0 )
			rst.x = 1.0;

    if ( ON_TextureMapping::TEXTURE_SPACE::divided == m_texture_space )
    {
      // side uses 0 <= x <= 2/3 region of the texture map
      rst.x *= 2.0;
			rst.x /= 3.0;
    }

    // convert height to normalized texture coordinate
  	rst.y = 0.5*rst.z + 0.5;
    if ( m_bCapped )
    {
      // clamp height
      if ( rst.y < 0.0 ) rst.y = 0.0; else if ( rst.y > 1.0 ) rst.y = 1.0;
    }
    side0 = 1;
	}
	rst.z = r;

	*T = m_uvw*rst;

  return side0;
}